

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O3

int VP8LBitWriterResize(VP8LBitWriter *bw,size_t extra_size)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  uint8_t *__dest;
  ulong uVar4;
  ulong uVar5;
  size_t __n;
  size_t size;
  
  puVar1 = bw->buf_;
  puVar2 = bw->cur_;
  __n = (long)puVar2 - (long)puVar1;
  uVar5 = extra_size + __n;
  iVar3 = 1;
  uVar4 = (long)bw->end_ - (long)puVar1;
  if ((uVar4 == 0) || (uVar4 < uVar5)) {
    uVar4 = uVar4 * 3 >> 1;
    if (uVar4 <= uVar5) {
      uVar4 = uVar5;
    }
    size = (uVar4 & 0xfffffffffffffc00) + 0x400;
    __dest = (uint8_t *)WebPSafeMalloc(1,size);
    if (__dest == (uint8_t *)0x0) {
      bw->error_ = 1;
      iVar3 = 0;
    }
    else {
      if (puVar2 != puVar1) {
        memcpy(__dest,bw->buf_,__n);
      }
      WebPSafeFree(bw->buf_);
      bw->buf_ = __dest;
      bw->cur_ = __dest + __n;
      bw->end_ = __dest + size;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int VP8LBitWriterResize(VP8LBitWriter* const bw, size_t extra_size) {
  uint8_t* allocated_buf;
  size_t allocated_size;
  const size_t max_bytes = bw->end_ - bw->buf_;
  const size_t current_size = bw->cur_ - bw->buf_;
  const uint64_t size_required_64b = (uint64_t)current_size + extra_size;
  const size_t size_required = (size_t)size_required_64b;
  if (size_required != size_required_64b) {
    bw->error_ = 1;
    return 0;
  }
  if (max_bytes > 0 && size_required <= max_bytes) return 1;
  allocated_size = (3 * max_bytes) >> 1;
  if (allocated_size < size_required) allocated_size = size_required;
  // make allocated size multiple of 1k
  allocated_size = (((allocated_size >> 10) + 1) << 10);
  allocated_buf = (uint8_t*)WebPSafeMalloc(1ULL, allocated_size);
  if (allocated_buf == NULL) {
    bw->error_ = 1;
    return 0;
  }
  if (current_size > 0) {
    memcpy(allocated_buf, bw->buf_, current_size);
  }
  WebPSafeFree(bw->buf_);
  bw->buf_ = allocated_buf;
  bw->cur_ = bw->buf_ + current_size;
  bw->end_ = bw->buf_ + allocated_size;
  return 1;
}